

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImRect ImGui::ShowMetricsWindow::Funcs::GetTableRect(ImGuiTable *table,int rect_type,int n)

{
  ImRect IVar1;
  ImGuiTableColumn *pIVar2;
  ImGuiTableColumn *c_6;
  ImGuiTableColumn *c_5;
  ImGuiTableColumn *c_4;
  ImGuiTableColumn *c_3;
  ImGuiTableColumn *c_2;
  ImGuiTableColumn *c_1;
  ImGuiTableColumn *c;
  int n_local;
  int rect_type_local;
  ImGuiTable *table_local;
  ImVec2 local_10;
  
  if (rect_type == 0) {
    table_local = *(ImGuiTable **)&(table->OuterRect).Min;
    local_10 = (table->OuterRect).Max;
  }
  else if (rect_type == 1) {
    table_local = *(ImGuiTable **)&(table->InnerRect).Min;
    local_10 = (table->InnerRect).Max;
  }
  else if (rect_type == 2) {
    table_local = *(ImGuiTable **)&(table->WorkRect).Min;
    local_10 = (table->WorkRect).Max;
  }
  else if (rect_type == 3) {
    table_local = *(ImGuiTable **)&(table->HostClipRect).Min;
    local_10 = (table->HostClipRect).Max;
  }
  else if (rect_type == 4) {
    table_local = *(ImGuiTable **)&(table->InnerClipRect).Min;
    local_10 = (table->InnerClipRect).Max;
  }
  else if (rect_type == 5) {
    table_local = *(ImGuiTable **)&(table->BgClipRect).Min;
    local_10 = (table->BgClipRect).Max;
  }
  else if (rect_type == 6) {
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,n);
    ImRect::ImRect((ImRect *)&table_local,pIVar2->MinX,(table->InnerClipRect).Min.y,pIVar2->MaxX,
                   (table->InnerClipRect).Min.y + table->LastOuterHeight);
  }
  else if (rect_type == 7) {
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,n);
    ImRect::ImRect((ImRect *)&table_local,pIVar2->WorkMinX,(table->WorkRect).Min.y,pIVar2->WorkMaxX,
                   (table->WorkRect).Max.y);
  }
  else if (rect_type == 8) {
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,n);
    table_local = *(ImGuiTable **)&(pIVar2->ClipRect).Min;
    local_10 = (pIVar2->ClipRect).Max;
  }
  else if (rect_type == 9) {
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,n);
    ImRect::ImRect((ImRect *)&table_local,pIVar2->WorkMinX,(table->InnerClipRect).Min.y,
                   pIVar2->ContentMaxXHeadersUsed,
                   (table->InnerClipRect).Min.y + table->LastFirstRowHeight);
  }
  else if (rect_type == 10) {
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,n);
    ImRect::ImRect((ImRect *)&table_local,pIVar2->WorkMinX,(table->InnerClipRect).Min.y,
                   pIVar2->ContentMaxXHeadersIdeal,
                   (table->InnerClipRect).Min.y + table->LastFirstRowHeight);
  }
  else if (rect_type == 0xb) {
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,n);
    ImRect::ImRect((ImRect *)&table_local,pIVar2->WorkMinX,(table->InnerClipRect).Min.y,
                   pIVar2->ContentMaxXFrozen,
                   (table->InnerClipRect).Min.y + table->LastFirstRowHeight);
  }
  else {
    if (rect_type != 0xc) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                    ,0x2ad6,
                    "static ImRect ImGui::ShowMetricsWindow(bool *)::Funcs::GetTableRect(ImGuiTable *, int, int)"
                   );
    }
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,n);
    ImRect::ImRect((ImRect *)&table_local,pIVar2->WorkMinX,
                   (table->InnerClipRect).Min.y + table->LastFirstRowHeight,
                   pIVar2->ContentMaxXUnfrozen,(table->InnerClipRect).Max.y);
  }
  IVar1.Max = local_10;
  IVar1.Min = (ImVec2)table_local;
  return IVar1;
}

Assistant:

static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }